

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O2

void __thiscall
cppcms::url_dispatcher::map_generic
          (url_dispatcher *this,string *method,regex *re,generic_handler *h)

{
  char *pcVar1;
  generic_option *__p;
  long lVar2;
  shared_ptr<cppcms::(anonymous_namespace)::option> opt;
  shared_ptr<cppcms::(anonymous_namespace)::option> local_60;
  long local_50;
  long local_48;
  
  __p = (generic_option *)operator_new(0x88);
  std::__cxx11::string::string((string *)&local_50,(string *)method);
  (__p->super_option)._vptr_option = (_func_int **)&PTR__option_002b3cf0;
  booster::regex::regex(&(__p->super_option).expr_,re);
  (__p->super_option).match_.offsets_.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->super_option).match_.offsets_.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->super_option).match_.offsets_.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->super_option).match_.begin_ = (char *)0x0;
  (__p->super_option).match_.end_ = (char *)0x0;
  (__p->super_option).match_method_ = 1;
  booster::regex::regex(&(__p->super_option).mexpr_,(string *)&local_50,0);
  std::__cxx11::string::string((string *)&(__p->super_option).method_,(string *)&local_50);
  lVar2 = 0;
  do {
    if (local_48 == lVar2) goto LAB_0020cf8f;
    pcVar1 = (char *)(local_50 + lVar2);
    lVar2 = lVar2 + 1;
  } while ((byte)(*pcVar1 + 0xbfU) < 0x1a);
  (__p->super_option).match_method_ = 2;
LAB_0020cf8f:
  (__p->super_option)._vptr_option = (_func_int **)&PTR__generic_option_002b3d18;
  std::function<bool_(cppcms::application_&,_const_booster::match_results<const_char_*>_&)>::
  function(&__p->handle_,h);
  std::shared_ptr<cppcms::(anonymous_namespace)::option>::
  shared_ptr<cppcms::(anonymous_namespace)::generic_option,void>(&local_60,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::
  vector<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
  ::push_back(&((this->d).ptr_)->options,&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_60.
              super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void url_dispatcher::map_generic(std::string const &method,booster::regex const &re,generic_handler const &h)
	{
		booster::shared_ptr<option> opt(new generic_option(method,re,h));
		d->options.push_back(opt);
	}